

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

void char_from_room(CHAR_DATA *ch)

{
  short *psVar1;
  ROOM_INDEX_DATA *room;
  OBJ_DATA *obj;
  ROOM_INDEX_DATA *pRVar2;
  CHAR_DATA *pCVar3;
  bool bVar4;
  CHAR_DATA **ppCVar5;
  byte bVar6;
  short sVar7;
  CHAR_DATA *pCVar8;
  AFFECT_DATA *pAVar9;
  int sn;
  ROOM_AFFECT_DATA *af;
  OBJ_DATA **ppOVar10;
  string_view fmt;
  
  room = ch->in_room;
  if (room == (ROOM_INDEX_DATA *)0x0) {
    fmt._M_str = "Char_from_room: nullptr.";
    fmt._M_len = 0x18;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  bVar4 = is_npc(ch);
  if (!bVar4) {
    psVar1 = &ch->in_room->area->nplayer;
    *psVar1 = *psVar1 + -1;
  }
  ppOVar10 = &ch->carrying;
  while (obj = *ppOVar10, obj != (OBJ_DATA *)0x0) {
    if ((obj->wear_loc != -1) &&
       (((obj->item_type == 1 || (bVar4 = is_obj_stat(obj,0), bVar4)) &&
        (pRVar2 = ch->in_room, pRVar2 != (ROOM_INDEX_DATA *)0x0)))) {
      sVar7 = pRVar2->light;
      if (sVar7 < 4) {
        sVar7 = 3;
      }
      pRVar2->light = sVar7 + -3;
    }
    ppOVar10 = &obj->next_content;
  }
  pRVar2 = ch->in_room;
  if ((ch->progtypes[0] & 0x200) != 0) {
    bVar6 = 0;
    ppCVar5 = &pRVar2->people;
    while (pCVar3 = *ppCVar5, pCVar3 != (CHAR_DATA *)0x0) {
      if (pCVar3 != ch) {
        bVar6 = bVar6 | (*(byte *)((long)pCVar3->progtypes + 1) & 2) >> 1;
      }
      ppCVar5 = &pCVar3->next_in_room;
    }
    if (bVar6 == 0) {
      pRVar2->move_progs = false;
    }
  }
  pCVar3 = pRVar2->people;
  if (pRVar2->people == ch) {
    ppCVar5 = &pRVar2->people;
  }
  else {
    do {
      pCVar8 = pCVar3;
      if (pCVar8 == (CHAR_DATA *)0x0) goto LAB_002f986c;
      pCVar3 = pCVar8->next_in_room;
    } while (pCVar8->next_in_room != ch);
    ppCVar5 = &pCVar8->next_in_room;
  }
  *ppCVar5 = ch->next_in_room;
LAB_002f986c:
  ch->next_in_room = (CHAR_DATA *)0x0;
  ch->on = (OBJ_DATA *)0x0;
  ch->in_room = (ROOM_INDEX_DATA *)0x0;
  sVar7 = gsn_gravity_well;
  bVar4 = is_affected_room(room,(int)gsn_gravity_well);
  if (bVar4) {
    af = (ROOM_AFFECT_DATA *)&room->affected;
    do {
      af = af->next;
      if (af == (ROOM_AFFECT_DATA *)0x0) break;
    } while (af->type != sVar7);
    if (af->owner == ch) {
      gravity_well_explode(room,af);
    }
  }
  sn = (int)gsn_pull;
  bVar4 = is_affected(ch,sn);
  if (!bVar4) {
    bVar4 = check_entwine(ch,1);
    if ((bVar4) || (bVar4 = check_entwine(ch,2), bVar4)) {
      pAVar9 = (AFFECT_DATA *)&ch->affected;
      while (pAVar9 = pAVar9->next, pAVar9 != (AFFECT_DATA *)0x0) {
        if ((pAVar9->type == gsn_entwine) && ((pAVar9->modifier == 1 || (pAVar9->location == 2))))
        break;
      }
      ch = pAVar9->owner;
      goto LAB_002f994e;
    }
    sn = (int)gsn_pull;
  }
  bVar4 = is_affected(ch,sn);
  if ((bVar4) || (bVar4 = check_entwine(ch,0), !bVar4)) {
    return;
  }
LAB_002f994e:
  do_uncoil(ch,"automagic");
  return;
}

Assistant:

void char_from_room(CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *prev_room = ch->in_room;
	ROOM_AFFECT_DATA *af;
	OBJ_DATA *obj;
	CHAR_DATA *mob;
	bool other= false;
	AFFECT_DATA *aaf;

	if (ch->in_room == nullptr)
	{
		RS.Logger.Debug("Char_from_room: nullptr.");
		return;
	}

	if (!is_npc(ch))
		--ch->in_room->area->nplayer;

	for (obj = ch->carrying; obj; obj = obj->next_content)
	{
		if (obj->wear_loc != WEAR_NONE)
		{
			if ((obj->item_type == ITEM_LIGHT || is_obj_stat(obj, ITEM_GLOW)) && ch->in_room)
				ch->in_room->light = std::max(0, ch->in_room->light - 3);
		}
	}

	if (IS_SET(ch->progtypes, MPROG_MOVE))
	{
		for (mob = ch->in_room->people; mob; mob = mob->next_in_room)
		{
			if (mob != ch && IS_SET(mob->progtypes, MPROG_MOVE))
				other = true;
		}

		if (!other)
			ch->in_room->move_progs = false;
	}

	if (ch == ch->in_room->people)
	{
		ch->in_room->people = ch->next_in_room;
	}
	else
	{
		CHAR_DATA *prev;

		for (prev = ch->in_room->people; prev; prev = prev->next_in_room)
		{
			if (prev->next_in_room == ch)
			{
				prev->next_in_room = ch->next_in_room;
				break;
			}
		}
		/*
		if ( prev == nullptr )
			RS.Logger.Warn("Char_from_room: ch not found.");
		*/
	}

	ch->in_room = nullptr;
	ch->next_in_room = nullptr;
	ch->on = nullptr; /* sanity check! */

	if (is_affected_room(prev_room, gsn_gravity_well))
	{
		for (af = prev_room->affected; af != nullptr; af = af->next)
		{
			if (af->type == gsn_gravity_well)
				break;
		}

		if (ch == af->owner)
			gravity_well_explode(prev_room, af);
	}
	if (!is_affected(ch, gsn_pull) && (check_entwine(ch, 1) || check_entwine(ch, 2)))
	{
		for (aaf = ch->affected; aaf != nullptr; aaf = aaf->next)
		{
			if (aaf->type == gsn_entwine && (aaf->modifier == 1 || aaf->location == APPLY_DEX))
				break;
		}

		do_uncoil(aaf->owner, "automagic");
	}
	else if (!is_affected(ch, gsn_pull) && check_entwine(ch, 0))
	{
		do_uncoil(ch, "automagic");
	}
}